

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp_std.cpp
# Opt level: O1

void * parseContent(SymbolContext<char> *ctx)

{
  long lVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  lVar1 = ctx->symbol->start;
  lVar4 = (long)ctx->context->m_window + lVar1;
  iVar7 = (int)ctx->symbol->end - (int)lVar1;
  iVar5 = 0;
  iVar6 = iVar5;
  if (0 < iVar7) {
    do {
      iVar2 = isspace(iVar5);
      iVar6 = iVar5;
      if (iVar2 == 0) break;
      iVar5 = iVar5 + 1;
      iVar6 = iVar7;
    } while (iVar7 != iVar5);
  }
  psVar3 = (string *)operator_new(0x20);
  if (iVar6 == iVar7) {
    *(string **)psVar3 = psVar3 + 0x10;
    *(undefined8 *)(psVar3 + 8) = 0;
    psVar3[0x10] = (string)0x0;
  }
  else {
    *(string **)psVar3 = psVar3 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>(psVar3,lVar4,iVar7 + lVar4);
  }
  return psVar3;
}

Assistant:

const std::string& get_content() const
    {
        return m_content;
    }